

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpropertyanimation.cpp
# Opt level: O2

void QPropertyAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char *pcVar4;
  long *plVar5;
  QObject *pQVar6;
  QBindableInterface *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == BindableProperty) {
    if (_id == 1) {
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[4].children.d.ptr;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>,_void>
                ::iface;
    }
    else {
      if (_id != 0) goto LAB_003692f8;
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[4].field_0x30;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>,_void>
                ::iface;
    }
    plVar5[1] = (long)pQVar7;
  }
  else if (_c == WriteProperty) {
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setTargetObject((QPropertyAnimation *)_o,(QObject *)(((QByteArray *)*_a)->d).d);
        return;
      }
      goto LAB_00369310;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setPropertyName((QPropertyAnimation *)_o,(QByteArray *)*_a);
        return;
      }
      goto LAB_00369310;
    }
  }
  else if (_c == ReadProperty) {
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      pQVar6 = targetObject((QPropertyAnimation *)_o);
      *puVar1 = pQVar6;
    }
    else if (_id == 0) {
      propertyName((QByteArray *)&local_38,(QPropertyAnimation *)_o);
      pDVar3 = (Data *)*puVar1;
      pcVar4 = (char *)puVar1[1];
      *puVar1 = local_38.d;
      puVar1[1] = local_38.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    }
  }
LAB_003692f8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00369310:
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPropertyAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QByteArray*>(_v) = _t->propertyName(); break;
        case 1: *reinterpret_cast<QObject**>(_v) = _t->targetObject(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPropertyName(*reinterpret_cast<QByteArray*>(_v)); break;
        case 1: _t->setTargetObject(*reinterpret_cast<QObject**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindablePropertyName(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTargetObject(); break;
        default: break;
        }
    }
}